

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

SmallVectorImpl<char> * __thiscall
llvm::SmallVectorImpl<char>::operator=(SmallVectorImpl<char> *this,SmallVectorImpl<char> *RHS)

{
  bool bVar1;
  iterator pcVar2;
  iterator pcVar3;
  iterator MinSize;
  iterator pcVar4;
  iterator pcVar5;
  char *local_38;
  iterator NewEnd;
  size_t CurSize;
  size_t RHSSize;
  SmallVectorImpl<char> *RHS_local;
  SmallVectorImpl<char> *this_local;
  
  if (this != RHS) {
    bVar1 = SmallVectorTemplateCommon<char,_void>::isSmall
                      ((SmallVectorTemplateCommon<char,_void> *)RHS);
    if (bVar1) {
      MinSize = (iterator)SmallVectorBase::size((SmallVectorBase *)RHS);
      NewEnd = (iterator)SmallVectorBase::size((SmallVectorBase *)this);
      if (NewEnd < MinSize) {
        pcVar4 = (iterator)SmallVectorBase::capacity((SmallVectorBase *)this);
        if (pcVar4 < MinSize) {
          pcVar2 = SmallVectorTemplateCommon<char,_void>::begin
                             ((SmallVectorTemplateCommon<char,_void> *)this);
          pcVar3 = SmallVectorTemplateCommon<char,_void>::end
                             ((SmallVectorTemplateCommon<char,_void> *)this);
          SmallVectorTemplateBase<char,_true>::destroy_range(pcVar2,pcVar3);
          SmallVectorBase::set_size((SmallVectorBase *)this,0);
          NewEnd = (iterator)0x0;
          SmallVectorTemplateBase<char,_true>::grow
                    (&this->super_SmallVectorTemplateBase<char,_true>,(size_t)MinSize);
        }
        else if (NewEnd != (iterator)0x0) {
          pcVar2 = SmallVectorTemplateCommon<char,_void>::begin
                             ((SmallVectorTemplateCommon<char,_void> *)RHS);
          pcVar3 = SmallVectorTemplateCommon<char,_void>::begin
                             ((SmallVectorTemplateCommon<char,_void> *)RHS);
          pcVar5 = SmallVectorTemplateCommon<char,_void>::begin
                             ((SmallVectorTemplateCommon<char,_void> *)this);
          std::move<char*,char*>(pcVar2,pcVar3 + (long)NewEnd,pcVar5);
        }
        pcVar2 = SmallVectorTemplateCommon<char,_void>::begin
                           ((SmallVectorTemplateCommon<char,_void> *)RHS);
        pcVar3 = SmallVectorTemplateCommon<char,_void>::end
                           ((SmallVectorTemplateCommon<char,_void> *)RHS);
        pcVar5 = SmallVectorTemplateCommon<char,_void>::begin
                           ((SmallVectorTemplateCommon<char,_void> *)this);
        SmallVectorTemplateBase<char,true>::uninitialized_move<char*,char*>
                  (pcVar2 + (long)NewEnd,pcVar3,pcVar5 + (long)NewEnd);
        SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
        clear(RHS);
      }
      else {
        local_38 = SmallVectorTemplateCommon<char,_void>::begin
                             ((SmallVectorTemplateCommon<char,_void> *)this);
        if (MinSize != (iterator)0x0) {
          pcVar2 = SmallVectorTemplateCommon<char,_void>::begin
                             ((SmallVectorTemplateCommon<char,_void> *)RHS);
          pcVar3 = SmallVectorTemplateCommon<char,_void>::end
                             ((SmallVectorTemplateCommon<char,_void> *)RHS);
          local_38 = std::move<char*,char*>(pcVar2,pcVar3,local_38);
        }
        pcVar2 = SmallVectorTemplateCommon<char,_void>::end
                           ((SmallVectorTemplateCommon<char,_void> *)this);
        SmallVectorTemplateBase<char,_true>::destroy_range(local_38,pcVar2);
        SmallVectorBase::set_size((SmallVectorBase *)this,(size_t)MinSize);
        clear(RHS);
      }
    }
    else {
      pcVar2 = SmallVectorTemplateCommon<char,_void>::begin
                         ((SmallVectorTemplateCommon<char,_void> *)this);
      pcVar3 = SmallVectorTemplateCommon<char,_void>::end
                         ((SmallVectorTemplateCommon<char,_void> *)this);
      SmallVectorTemplateBase<char,_true>::destroy_range(pcVar2,pcVar3);
      bVar1 = SmallVectorTemplateCommon<char,_void>::isSmall
                        ((SmallVectorTemplateCommon<char,_void> *)this);
      if (!bVar1) {
        pcVar2 = SmallVectorTemplateCommon<char,_void>::begin
                           ((SmallVectorTemplateCommon<char,_void> *)this);
        free(pcVar2);
      }
      (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.BeginX =
           (RHS->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
      (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Size =
           (RHS->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      (this->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
      super_SmallVectorBase.Capacity =
           (RHS->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity;
      SmallVectorTemplateCommon<char,_void>::resetToSmall
                ((SmallVectorTemplateCommon<char,_void> *)RHS);
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->Size = RHS.Size;
    this->Capacity = RHS.Capacity;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->set_size(RHSSize);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);

  RHS.clear();
  return *this;
}